

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

ostream * cmsys::anon_unknown_3::operator<<(ostream *os,SymbolProperties *sp)

{
  void *pvVar1;
  void *pvVar2;
  ostream *poVar3;
  long lVar4;
  string local_88;
  string local_68;
  string local_38;
  SymbolProperties *local_18;
  SymbolProperties *sp_local;
  ostream *os_local;
  
  local_18 = sp;
  sp_local = (SymbolProperties *)os;
  pvVar1 = (void *)std::ostream::operator<<(os,std::hex);
  pvVar2 = SymbolProperties::GetAddress(local_18);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar1,pvVar2);
  poVar3 = std::operator<<(poVar3," : ");
  (anonymous_namespace)::SymbolProperties::GetFunction_abi_cxx11_(&local_38,local_18);
  poVar3 = std::operator<<(poVar3,(string *)&local_38);
  poVar3 = std::operator<<(poVar3," [(");
  (anonymous_namespace)::SymbolProperties::GetBinary_abi_cxx11_(&local_68,local_18);
  poVar3 = std::operator<<(poVar3,(string *)&local_68);
  poVar3 = std::operator<<(poVar3,") ");
  (anonymous_namespace)::SymbolProperties::GetSourceFile_abi_cxx11_(&local_88,local_18);
  poVar3 = std::operator<<(poVar3,(string *)&local_88);
  poVar3 = std::operator<<(poVar3,":");
  pvVar1 = (void *)std::ostream::operator<<(poVar3,std::dec);
  lVar4 = SymbolProperties::GetLineNumber(local_18);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar1,lVar4);
  std::operator<<(poVar3,"]");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)sp_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SymbolProperties& sp)
{
#  if defined(KWSYS_SYSTEMINFORMATION_HAS_SYMBOL_LOOKUP)
  os << std::hex << sp.GetAddress() << " : " << sp.GetFunction() << " [("
     << sp.GetBinary() << ") " << sp.GetSourceFile() << ":" << std::dec
     << sp.GetLineNumber() << "]";
#  elif defined(KWSYS_SYSTEMINFORMATION_HAS_BACKTRACE)
  void* addr = sp.GetAddress();
  char** syminfo = backtrace_symbols(&addr, 1);
  os << safes(syminfo[0]);
  free(syminfo);
#  else
  (void)os;
  (void)sp;
#  endif
  return os;
}